

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestInfo
               (ostream *stream,char *test_suite_name,TestInfo *test_info)

{
  bool bVar1;
  int value;
  ostream *poVar2;
  char *pcVar3;
  internal *piVar4;
  size_t width;
  size_t width_00;
  size_t width_01;
  TimeInMillis ms;
  TimeInMillis ms_00;
  char *local_4e8;
  string local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  allocator<char> local_381;
  string local_380;
  string local_360;
  allocator<char> local_339;
  string local_338;
  string local_318;
  allocator<char> local_2f1;
  string local_2f0;
  allocator<char> local_2c9;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  undefined4 local_22c;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  string local_a0;
  undefined1 local_80 [8];
  string kIndent;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string kTestsuite;
  TestResult *result;
  TestInfo *test_info_local;
  char *test_suite_name_local;
  ostream *stream_local;
  
  kTestsuite.field_2._8_8_ = TestInfo::result(test_info);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"testcase",&local_49);
  std::allocator<char>::~allocator(&local_49);
  Indent_abi_cxx11_((string *)local_80,(internal *)0xa,width);
  Indent_abi_cxx11_(&local_a0,(internal *)0x8,width_00);
  poVar2 = std::operator<<(stream,(string *)&local_a0);
  std::operator<<(poVar2,"{\n");
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"name",&local_c1);
  pcVar3 = TestInfo::name(test_info);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,pcVar3,&local_e9);
  OutputJsonKey(stream,(string *)local_48,&local_c0,&local_e8,(string *)local_80,true);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  pcVar3 = TestInfo::value_param(test_info);
  if (pcVar3 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"value_param",&local_111);
    pcVar3 = TestInfo::value_param(test_info);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,pcVar3,&local_139);
    OutputJsonKey(stream,(string *)local_48,&local_110,&local_138,(string *)local_80,true);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator(&local_139);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
  }
  pcVar3 = TestInfo::type_param(test_info);
  if (pcVar3 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"type_param",&local_161)
    ;
    pcVar3 = TestInfo::type_param(test_info);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,pcVar3,&local_189);
    OutputJsonKey(stream,(string *)local_48,&local_160,&local_188,(string *)local_80,true);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator(&local_189);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator(&local_161);
  }
  if ((FLAGS_gtest_list_tests & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"status",&local_251);
    bVar1 = TestInfo::should_run(test_info);
    pcVar3 = "NOTRUN";
    if (bVar1) {
      pcVar3 = "RUN";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,pcVar3,&local_279);
    OutputJsonKey(stream,(string *)local_48,&local_250,&local_278,(string *)local_80,true);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"result",&local_2a1);
    bVar1 = TestInfo::should_run(test_info);
    if (bVar1) {
      bVar1 = TestResult::Skipped((TestResult *)kTestsuite.field_2._8_8_);
      local_4e8 = "COMPLETED";
      if (bVar1) {
        local_4e8 = "SKIPPED";
      }
    }
    else {
      local_4e8 = "SUPPRESSED";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,local_4e8,&local_2c9);
    OutputJsonKey(stream,(string *)local_48,&local_2a0,&local_2c8,(string *)local_80,true);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::allocator<char>::~allocator(&local_2c9);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator(&local_2a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"timestamp",&local_2f1);
    piVar4 = (internal *)TestResult::start_timestamp((TestResult *)kTestsuite.field_2._8_8_);
    FormatEpochTimeInMillisAsRFC3339_abi_cxx11_(&local_318,piVar4,ms);
    OutputJsonKey(stream,(string *)local_48,&local_2f0,&local_318,(string *)local_80,true);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator(&local_2f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"time",&local_339);
    piVar4 = (internal *)TestResult::elapsed_time((TestResult *)kTestsuite.field_2._8_8_);
    FormatTimeInMillisAsDuration_abi_cxx11_(&local_360,piVar4,ms_00);
    OutputJsonKey(stream,(string *)local_48,&local_338,&local_360,(string *)local_80,true);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_338);
    std::allocator<char>::~allocator(&local_339);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"classname",&local_381);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,test_suite_name,&local_3a9);
    OutputJsonKey(stream,(string *)local_48,&local_380,&local_3a8,(string *)local_80,false);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::allocator<char>::~allocator(&local_3a9);
    std::__cxx11::string::~string((string *)&local_380);
    std::allocator<char>::~allocator(&local_381);
    TestPropertiesAsJson(&local_3d0,(TestResult *)kTestsuite.field_2._8_8_,(string *)local_80);
    std::operator<<(stream,(string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_3d0);
    OutputJsonTestResult(stream,(TestResult *)kTestsuite.field_2._8_8_);
    local_22c = 0;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"file",&local_1b1);
    pcVar3 = TestInfo::file(test_info);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,pcVar3,&local_1d9);
    OutputJsonKey(stream,(string *)local_48,&local_1b0,&local_1d8,(string *)local_80,true);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator(&local_1b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"line",&local_201);
    value = TestInfo::line(test_info);
    OutputJsonKey(stream,(string *)local_48,&local_200,value,(string *)local_80,false);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    poVar2 = std::operator<<(stream,"\n");
    Indent_abi_cxx11_(&local_228,(internal *)0x8,width_01);
    poVar2 = std::operator<<(poVar2,(string *)&local_228);
    std::operator<<(poVar2,"}");
    std::__cxx11::string::~string((string *)&local_228);
    local_22c = 1;
  }
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestInfo(::std::ostream* stream,
                                                   const char* test_suite_name,
                                                   const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestsuite = "testcase";
  const std::string kIndent = Indent(10);

  *stream << Indent(8) << "{\n";
  OutputJsonKey(stream, kTestsuite, "name", test_info.name(), kIndent);

  if (test_info.value_param() != nullptr) {
    OutputJsonKey(stream, kTestsuite, "value_param", test_info.value_param(),
                  kIndent);
  }
  if (test_info.type_param() != nullptr) {
    OutputJsonKey(stream, kTestsuite, "type_param", test_info.type_param(),
                  kIndent);
  }
  if (GTEST_FLAG(list_tests)) {
    OutputJsonKey(stream, kTestsuite, "file", test_info.file(), kIndent);
    OutputJsonKey(stream, kTestsuite, "line", test_info.line(), kIndent, false);
    *stream << "\n" << Indent(8) << "}";
    return;
  }

  OutputJsonKey(stream, kTestsuite, "status",
                test_info.should_run() ? "RUN" : "NOTRUN", kIndent);
  OutputJsonKey(stream, kTestsuite, "result",
                test_info.should_run()
                    ? (result.Skipped() ? "SKIPPED" : "COMPLETED")
                    : "SUPPRESSED",
                kIndent);
  OutputJsonKey(stream, kTestsuite, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(result.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuite, "time",
                FormatTimeInMillisAsDuration(result.elapsed_time()), kIndent);
  OutputJsonKey(stream, kTestsuite, "classname", test_suite_name, kIndent,
                false);
  *stream << TestPropertiesAsJson(result, kIndent);

  OutputJsonTestResult(stream, result);
}